

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O3

int fs_st_mode(string_view path)

{
  int iVar1;
  int *piVar2;
  stat s;
  statx sx;
  stat sStack_198;
  undefined1 local_108 [28];
  ushort local_ec;
  
  iVar1 = statx(0xffffff9c,path._M_str,0x800,2,local_108);
  if (iVar1 == 0) {
    sStack_198.st_mode = (__mode_t)local_ec;
  }
  else {
    piVar2 = __errno_location();
    if ((*piVar2 != 0x26) || (iVar1 = stat(path._M_str,&sStack_198), iVar1 != 0)) {
      sStack_198.st_mode = 0;
    }
  }
  return sStack_198.st_mode;
}

Assistant:

int
fs_st_mode(std::string_view path)
{
  int r = 0;
#if defined(STATX_MODE) && defined(USE_STATX)
// Linux Glibc only
// https://www.gnu.org/software/gnulib/manual/html_node/statx.html
// https://www.man7.org/linux/man-pages/man2/statx.2.html

  struct statx sx;
  r = statx(AT_FDCWD, path.data(), AT_NO_AUTOMOUNT, STATX_MODE, &sx);
  if (r == 0) FFS_LIKELY
    return sx.stx_mode;
#endif

// https://learn.microsoft.com/en-us/cpp/c-runtime-library/reference/stat-functions
  if(r == 0 || errno == ENOSYS){
    if (struct stat s; !stat(path.data(), &s))
      return s.st_mode;
  }

  return 0;
}